

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACEncode.h
# Opt level: O0

void inflating<std::ofstream>
               (FreqTable *freqs,BitInStream *bitin,
               basic_ofstream<char,_std::char_traits<char>_> *out,int minLen)

{
  int iVar1;
  uint uVar2;
  size_t in_RCX;
  char in_DL;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  long in_RSI;
  int in_EDI;
  int sym;
  int len;
  bool flag;
  Inflate inf;
  int local_98;
  BitInStream *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  Inflate *in_stack_ffffffffffffff90;
  bool local_30;
  
  iVar1 = (int)in_RCX;
  Inflate::Inflate(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
  local_98 = 0;
  __buf = extraout_RDX;
  while( true ) {
    Inflate::read((Inflate *)&stack0xffffffffffffff70,in_EDI,__buf,in_RCX);
    uVar2 = iVar1 - 1;
    in_RCX = (size_t)uVar2;
    if (((((int)uVar2 <= local_98) && ((local_30 & 1U) != 0)) &&
        ((*(byte *)(in_RSI + 0x49) & 1) != 0)) && (*(int *)(in_RSI + 0x4c) < 1)) break;
    std::ostream::put(in_DL);
    local_98 = local_98 + 1;
    __buf = extraout_RDX_00;
  }
  std::ostream::put(in_DL);
  return;
}

Assistant:

void inflating(FreqTable &freqs, BitInStream &bitin, T &out, int minLen = 0) {
    Inflate inf(16, bitin);
    bool flag = false;
    int len = 0;
    while (true) {
        int sym = inf.read(freqs);
        if (len >= minLen - 1) {
            if (inf.readingDone) {
                if(bitin.streamDone && (bitin.remBits <= 0)){
                    out.put(char(sym));
                    break;
                }
            }
        }
        out.put(char(sym));
        len++;
    }
}